

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O0

void __thiscall
PatternModel::setCursorColumnImpl(PatternModel *this,int column,CursorChangeFlags *flags)

{
  Int IVar1;
  reference pvVar2;
  Int local_2c;
  Int local_28;
  int local_24;
  CursorChangeFlags *pCStack_20;
  int track;
  CursorChangeFlags *flags_local;
  PatternModel *pPStack_10;
  int column_local;
  PatternModel *this_local;
  
  if (column != (this->mCursor).super_PatternCursorBase.column) {
    pCStack_20 = flags;
    flags_local._4_4_ = column;
    pPStack_10 = this;
    if (column < 0) {
      local_24 = (this->mCursor).super_PatternCursorBase.track + -1;
      setCursorTrackImpl(this,local_24,flags);
      local_28 = (Int)QFlags<PatternModel::CursorChangeFlag>::operator&
                                (pCStack_20,CursorTrackChanged);
      IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_28);
      if (IVar1 == 0) {
        flags_local._4_4_ = 0;
      }
      else {
        pvVar2 = std::array<int,_4UL>::operator[]
                           (&this->mMaxColumns,(long)(this->mCursor).super_PatternCursorBase.track);
        flags_local._4_4_ = *pvVar2 + -1;
      }
    }
    else {
      pvVar2 = std::array<int,_4UL>::operator[]
                         (&this->mMaxColumns,(long)(this->mCursor).super_PatternCursorBase.track);
      if (*pvVar2 <= column) {
        setCursorTrackImpl(this,(this->mCursor).super_PatternCursorBase.track + 1,pCStack_20);
        local_2c = (Int)QFlags<PatternModel::CursorChangeFlag>::operator&
                                  (pCStack_20,CursorTrackChanged);
        IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_2c);
        if (IVar1 == 0) {
          pvVar2 = std::array<int,_4UL>::operator[]
                             (&this->mMaxColumns,(long)(this->mCursor).super_PatternCursorBase.track
                             );
          flags_local._4_4_ = *pvVar2 + -1;
        }
        else {
          flags_local._4_4_ = 0;
        }
      }
    }
    if ((this->mCursor).super_PatternCursorBase.column != flags_local._4_4_) {
      (this->mCursor).super_PatternCursorBase.column = flags_local._4_4_;
      QFlags<PatternModel::CursorChangeFlag>::operator|=(pCStack_20,CursorColumnChanged);
    }
  }
  return;
}

Assistant:

void PatternModel::setCursorColumnImpl(int column, CursorChangeFlags &flags) {
    if (column == mCursor.column) {
        return;
    }

    if (column < 0) {
        auto track = mCursor.track - 1;
        setCursorTrackImpl(track, flags);
        if (flags & CursorTrackChanged) {
            column = mMaxColumns[mCursor.track] - 1;
        } else {
            column = 0;
        }
    } else if (column >= mMaxColumns[mCursor.track]) {
        setCursorTrackImpl(mCursor.track + 1, flags);
        if (flags & CursorTrackChanged) {
            column = 0;
        } else {
            column = mMaxColumns[mCursor.track] - 1;
        }
    }

    if (mCursor.column != column) {
        mCursor.column = column;
        flags |= CursorColumnChanged;
    }

}